

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O2

void __thiscall CommandLineParser::getNextOption(CommandLineParser *this)

{
  bool bVar1;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"-",&local_59);
  bVar1 = argumentStartsWith(this,&local_58);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"--",&local_5a);
    bVar1 = argumentStartsWith(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    if (!bVar1) {
      std::__cxx11::string::assign((char *)&this->m_option);
      return;
    }
  }
  getNextArgument_abi_cxx11_(&local_58,this);
  std::__cxx11::string::operator=((string *)&this->m_option,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void 
CommandLineParser::getNextOption()
{
  if ( argumentStartsWith( "-" )  ||  argumentStartsWith( "--" ) )
    m_option = getNextArgument();
  else
    m_option = "";
}